

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priority_queue.h
# Opt level: O0

void __thiscall
CP::
priority_queue<Song,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/noppakorn[P]2110211/grader/d58_q2_custom/song.h:33:11)>
::fixUp(priority_queue<Song,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_noppakorn[P]2110211_grader_d58_q2_custom_song_h:33:11)>
        *this,size_t idx)

{
  bool bVar1;
  ulong uVar2;
  size_t p;
  Song tmp;
  size_t idx_local;
  priority_queue<Song,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_noppakorn[P]2110211_grader_d58_q2_custom_song_h:33:11)>
  *this_local;
  
  tmp._64_8_ = idx;
  Song::Song((Song *)&p,this->mData + idx);
  while (tmp._64_8_ != 0) {
    uVar2 = tmp._64_8_ - 1 >> 1;
    bVar1 = anon_class_1_0_00000001_for_mLess::operator()
                      ((anon_class_1_0_00000001_for_mLess *)&this->field_0x18,(Song *)&p,
                       this->mData + uVar2);
    if (bVar1) break;
    Song::operator=(this->mData + tmp._64_8_,this->mData + uVar2);
    tmp._64_8_ = uVar2;
  }
  Song::operator=(this->mData + tmp._64_8_,(Song *)&p);
  Song::~Song((Song *)&p);
  return;
}

Assistant:

void fixUp(size_t idx) {
      T tmp = mData[idx];
      while (idx > 0) {
        size_t p = (idx - 1) / 2;
        if ( mLess(tmp,mData[p]) ) break;
        mData[idx] = mData[p];
        idx = p;
      }
      mData[idx] = tmp;
    }